

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmCTest *pcVar3;
  bool bVar4;
  cmCTestBuildHandler *pcVar5;
  cmValue cVar6;
  cmValue __rhs;
  string *native;
  string *target;
  cmake *gname;
  _Alloc_hider _Var7;
  ostream *poVar8;
  string dir;
  string buildCommand;
  string cmakeBuildConfiguration;
  string local_1c8;
  undefined7 uStack_1c7;
  ostringstream cmCTestLog_msg;
  
  pcVar5 = cmCTest::GetBuildHandler((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(pcVar5->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])(pcVar5);
  this->Handler = pcVar5;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_BUILD_COMMAND",(allocator<char> *)&dir);
  cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
               cVar6.Value,(this->super_cmCTestHandlerCommand).Quiet);
    goto LAB_001ddf19;
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_CMAKE_GENERATOR",(allocator<char> *)&dir);
  __rhs = cmMakefile::GetDefinition(pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_BUILD_CONFIGURATION",(allocator<char> *)&dir);
  cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if ((this->Configuration)._M_string_length == 0) {
    if ((cVar6.Value == (string *)0x0) || ((cVar6.Value)->_M_string_length == 0)) {
      cVar6.Value = cmCTest::GetConfigType_abi_cxx11_
                              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
    }
  }
  else {
    cVar6.Value = &this->Configuration;
  }
  std::__cxx11::string::string((string *)&cmakeBuildConfiguration,(string *)cVar6.Value);
  if ((this->Flags)._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"CTEST_BUILD_FLAGS",(allocator<char> *)&dir);
    native = cmMakefile::GetSafeDefinition(pcVar1,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  else {
    native = &this->Flags;
  }
  if ((this->Target)._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"CTEST_BUILD_TARGET",(allocator<char> *)&dir);
    target = cmMakefile::GetSafeDefinition(pcVar1,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  else {
    target = &this->Target;
  }
  if ((__rhs.Value == (string *)0x0) || ((__rhs.Value)->_M_string_length == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,
                    "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR is set. Otherwise, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                   );
    std::__cxx11::stringbuf::str();
    cmCommand::SetError((cmCommand *)this,&dir);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    goto LAB_001de034;
  }
  if (cmakeBuildConfiguration._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&cmakeBuildConfiguration);
  }
  pcVar2 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  if (pcVar2 == (cmGlobalGenerator *)0x0) {
LAB_001ddd51:
    gname = cmMakefile::GetCMakeInstance
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                       Makefile);
    cmake::CreateGlobalGenerator((cmake *)&cmCTestLog_msg,(string *)gname,SUB81(__rhs.Value,0));
    _Var7._M_p = _cmCTestLog_msg;
    _cmCTestLog_msg = (pointer)0x0;
    pcVar2 = (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    (this->GlobalGenerator)._M_t.
    super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)_Var7._M_p
    ;
    if (pcVar2 != (cmGlobalGenerator *)0x0) {
      (*pcVar2->_vptr_cmGlobalGenerator[1])();
      if ((cmGlobalGenerator *)_cmCTestLog_msg != (cmGlobalGenerator *)0x0) {
        (**(code **)(*(long *)_cmCTestLog_msg + 8))();
      }
      _Var7._M_p = (pointer)(this->GlobalGenerator)._M_t.
                            super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                            .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    }
    if ((cmGlobalGenerator *)_Var7._M_p == (cmGlobalGenerator *)0x0) {
      _cmCTestLog_msg = (pointer)0x22;
      dir._M_string_length = (size_type)((__rhs.Value)->_M_dataplus)._M_p;
      dir._M_dataplus._M_p = (pointer)(__rhs.Value)->_M_string_length;
      local_1c8 = (string)0x22;
      cmStrCat<char>(&buildCommand,(cmAlphaNum *)&cmCTestLog_msg,(cmAlphaNum *)&dir,
                     (char *)&local_1c8);
      cmMakefile::IssueMessage
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile,
                 FATAL_ERROR,&buildCommand);
      cmSystemTools::s_FatalErrorOccurred = true;
      std::__cxx11::string::~string((string *)&buildCommand);
LAB_001de034:
      std::__cxx11::string::~string((string *)&cmakeBuildConfiguration);
      return (cmCTestGenericHandler *)0x0;
    }
  }
  else {
    (*pcVar2->_vptr_cmGlobalGenerator[3])(&cmCTestLog_msg);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cmCTestLog_msg,__rhs.Value);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (bVar4) {
      pcVar2 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      (this->GlobalGenerator)._M_t.
      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)0x0;
      if (pcVar2 == (cmGlobalGenerator *)0x0) goto LAB_001ddd51;
      (*pcVar2->_vptr_cmGlobalGenerator[1])();
    }
    if ((this->GlobalGenerator)._M_t.
        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0)
    goto LAB_001ddd51;
  }
  if (cmakeBuildConfiguration._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&cmakeBuildConfiguration);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"BuildDirectory",(allocator<char> *)&buildCommand);
  cmCTest::GetCTestConfiguration(&dir,pcVar3,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar2 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  bVar4 = cmMakefile::IgnoreErrorsCMP0061
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                     Makefile);
  cmGlobalGenerator::GenerateCMakeBuildCommand
            (&buildCommand,pcVar2,target,&cmakeBuildConfiguration,&this->ParallelLevel,native,bVar4)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"SetMakeCommand:");
  poVar8 = std::operator<<(poVar8,(string *)&buildCommand);
  std::operator<<(poVar8,"\n");
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
               ,0x6a,(char *)CONCAT71(uStack_1c7,local_1c8),
               (this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string(&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
             &buildCommand,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&buildCommand);
  std::__cxx11::string::~string((string *)&dir);
  std::__cxx11::string::~string((string *)&cmakeBuildConfiguration);
LAB_001ddf19:
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_USE_LAUNCHERS",(allocator<char> *)&dir);
  cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar6.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",
               cVar6.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_LABELS_FOR_SUBPROJECTS",(allocator<char> *)&dir);
  cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar6.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,cVar6.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  (pcVar5->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  return &pcVar5->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestBuildHandler* handler = this->CTest->GetBuildHandler();
  handler->Initialize();

  this->Handler = handler;

  cmValue ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (cmNonempty(ctestBuildCommand)) {
    this->CTest->SetCTestConfiguration("MakeCommand", *ctestBuildCommand,
                                       this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    cmValue ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    std::string cmakeBuildConfiguration = cmNonempty(this->Configuration)
      ? this->Configuration
      : cmNonempty(ctestBuildConfiguration) ? *ctestBuildConfiguration
                                            : this->CTest->GetConfigType();

    const std::string& cmakeBuildAdditionalFlags = cmNonempty(this->Flags)
      ? this->Flags
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_FLAGS");
    const std::string& cmakeBuildTarget = cmNonempty(this->Target)
      ? this->Target
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_TARGET");

    if (cmNonempty(cmakeGeneratorName)) {
      if (cmakeBuildConfiguration.empty()) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != *cmakeGeneratorName) {
          this->GlobalGenerator.reset();
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            *cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = cmStrCat("could not create generator named \"",
                                   *cmakeGeneratorName, '"');
          this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccurred();
          return nullptr;
        }
      }
      if (cmakeBuildConfiguration.empty()) {
#ifdef CMAKE_INTDIR
        cmakeBuildConfiguration = CMAKE_INTDIR;
#else
        cmakeBuildConfiguration = "Debug";
#endif
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget, cmakeBuildConfiguration, this->ParallelLevel,
          cmakeBuildAdditionalFlags, this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand,
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "is set. Otherwise, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return nullptr;
    }
  }

  if (cmValue useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", *useLaunchers,
                                       this->Quiet);
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}